

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O0

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_reentrant_consume_samples(ostream *param_1)

{
  ControlBlock **this;
  bool bVar1;
  type_conflict tVar2;
  int *piVar3;
  reference pbVar4;
  undefined1 local_208 [8];
  reentrant_consume_operation consume_1;
  anon_class_16_2_b7b7fce5 func2_1;
  anon_class_8_1_a8890831_for_func1 func1_1;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_3;
  anon_class_16_2_b7b7fce5 func2;
  anon_class_8_1_a8890831_for_func1 func1;
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  type return_value_1;
  int sum_1;
  consume_operation consume;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings_1;
  undefined1 local_e0 [8];
  Queue queue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  type return_value;
  int sum;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  anon_class_1_0_00000001 local_49;
  undefined1 local_48 [8];
  conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  ostream *param_8_local;
  
  queue.m_queue.m_queue.m_tail = (ControlBlock *)param_1;
  density::
  conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_48);
  density::
  conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_1_>
            ((conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_48,&local_49);
  density::
  conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_2_>
            ((conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_48,
             (anon_class_1_0_00000001 *)
             ((long)&strings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&return_value.m_has_value);
  return_value.m_storage = (type)0x0;
  do {
    density::
    conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_consume((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)((long)&__range3 + 4),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_48);
    bVar1 = density::builtin_optional::operator_cast_to_bool
                      ((builtin_optional *)((long)&__range3 + 4));
    if (bVar1) {
      piVar3 = density::builtin_optional<int>::operator*
                         ((builtin_optional<int> *)((long)&__range3 + 4));
      return_value.m_storage.__data = *piVar3 + return_value.m_storage.__data;
      __range3._0_4_ = 0;
    }
    else {
      __range3._0_4_ = 3;
    }
    density::builtin_optional<int>::~builtin_optional
              ((builtin_optional<int> *)((long)&__range3 + 4));
  } while ((int)__range3 == 0);
  if (return_value.m_storage != (type)0x5) {
    __assert_fail("sum == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x159,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_consume_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&return_value.m_has_value);
  str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&return_value.m_has_value);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&str), bVar1) {
    queue_1.m_queue.m_queue.m_tail =
         (ControlBlock *)
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end3);
    std::operator<<((ostream *)&std::cout,(string *)queue_1.m_queue.m_queue.m_tail);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&return_value.m_has_value);
  density::
  conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_48);
  density::
  conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_e0);
  density::
  conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_3_>
            ((conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_e0,
             (anon_class_1_0_00000001 *)
             ((long)&strings_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  density::
  conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)_4_>
            ((conc_function_queue<int(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_e0,
             (anon_class_1_0_00000001 *)
             ((long)&strings_1.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&consume.m_consume_operation.m_control);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::consume_operation((consume_operation *)&return_value_1.m_has_value);
  return_value_1.m_storage = (type)0x0;
  do {
    density::
    conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_consume((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)((long)&__range3_1 + 4),(consume_operation *)local_e0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&return_value_1.m_has_value);
    bVar1 = density::builtin_optional::operator_cast_to_bool
                      ((builtin_optional *)((long)&__range3_1 + 4));
    if (bVar1) {
      piVar3 = density::builtin_optional<int>::operator*
                         ((builtin_optional<int> *)((long)&__range3_1 + 4));
      return_value_1.m_storage.__data = *piVar3 + return_value_1.m_storage.__data;
      __range3._0_4_ = 0;
    }
    else {
      __range3._0_4_ = 7;
    }
    density::builtin_optional<int>::~builtin_optional
              ((builtin_optional<int> *)((long)&__range3_1 + 4));
  } while ((int)__range3 == 0);
  if (return_value_1.m_storage != (type)0x5) {
    __assert_fail("sum == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x17e,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_consume_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  this = &consume.m_consume_operation.m_control;
  __end3_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this);
  str_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&str_1), bVar1) {
    pbVar4 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end3_1);
    std::operator<<((ostream *)&std::cout,(string *)pbVar4);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3_1);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>,_density::basic_default_allocator<65536UL>_>
  ::consume_operation::~consume_operation((consume_operation *)&return_value_1.m_has_value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&consume.m_consume_operation.m_control);
  density::
  conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<int_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_e0);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&func1);
  queue_3.m_queue.m_queue.m_tail = (ControlBlock *)&func1;
  func2.queue = (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                 *)&func1;
  func2.func1.queue =
       (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
        *)&func1;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_1_&>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)&func1,&func2.func1);
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_2_&>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)&func1,(anon_class_16_2_b7b7fce5 *)&queue_3.m_queue.m_queue.m_tail);
  do {
    tVar2 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume
                      ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)&func1);
  } while (tVar2);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&func1);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&func1_1);
  consume_1.m_consume_operation.m_control = (ControlBlock *)&func1_1;
  func2_1.queue =
       (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
        *)&func1_1;
  func2_1.func1.queue =
       (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
        *)&func1_1;
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_3_&>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)&func1_1,&func2_1.func1);
  density::
  conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_consume_samples(std::ostream&)::_lambda()_4_&>
            ((conc_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)&func1_1,(anon_class_16_2_b7b7fce5 *)&consume_1.m_consume_operation.m_control);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::reentrant_consume_operation
            ((reentrant_consume_operation *)local_208);
  do {
    tVar2 = density::
            conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume
                      ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)&func1_1,(reentrant_consume_operation *)local_208);
  } while (tVar2);
  density::
  conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_consume_operation::~reentrant_consume_operation
            ((reentrant_consume_operation *)local_208);
  density::
  conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&func1_1);
  return;
}

Assistant:

static void func_queue_reentrant_consume_samples(std::ostream &)
        {
            using namespace density;

            {
                //! [conc_function_queue try_consume example 1]
                conc_function_queue<
                  int(std::vector<std::string> & vect),
                  default_allocator,
                  ERASURE>
                  queue;

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back("Hello");
                    return 2;
                });

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back(" world!");
                    return 3;
                });

                std::vector<std::string> strings;

                int sum = 0;
                while (auto const return_value = queue.try_consume(strings))
                {
                    sum += *return_value;
                }

                assert(sum == 5);

                for (auto const & str : strings)
                    std::cout << str;
                std::cout << std::endl;
                //! [conc_function_queue try_consume example 1]
            }

            {
                //! [conc_function_queue try_consume example 2]
                using Queue = conc_function_queue<
                  int(std::vector<std::string> & vect),
                  default_allocator,
                  ERASURE>;
                Queue queue;

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back("Hello");
                    return 2;
                });

                queue.push([](std::vector<std::string> & vect) {
                    vect.push_back(" world!");
                    return 3;
                });

                std::vector<std::string> strings;

                // providing a cached consume_operation gives better performances
                typename Queue::consume_operation consume;

                int sum = 0;
                while (auto const return_value = queue.try_consume(consume, strings))
                {
                    sum += *return_value;
                }

                assert(sum == 5);

                for (auto const & str : strings)
                    std::cout << str;
                std::cout << std::endl;
                //! [conc_function_queue try_consume example 2]
            }

            {
                //! [conc_function_queue try_reentrant_consume example 1]
                conc_function_queue<void(), default_allocator, ERASURE> queue;

                auto func1 = [&queue] {
                    std::cout << (queue.empty() ? "The queue is empty" : "The queue is not empty")
                              << std::endl;
                };

                auto func2 = [&queue, func1] { queue.push(func1); };

                queue.push(func1);
                queue.push(func2);

                /* The callable objects we are going to invoke will access the queue, so we
                    must use a reentrant consume. Note: during the invoke of the last function
                    the queue is empty to any observer. */
                while (queue.try_reentrant_consume())
                    ;

                // Output:
                // The queue is not empty
                // The queue is empty
                //! [conc_function_queue try_reentrant_consume example 1]
            }
            {
                //! [conc_function_queue try_reentrant_consume example 2]
                conc_function_queue<void(), default_allocator, ERASURE> queue;

                auto func1 = [&queue] {
                    std::cout << (queue.empty() ? "The queue is empty" : "The queue is not empty")
                              << std::endl;
                };

                auto func2 = [&queue, func1] { queue.push(func1); };

                queue.push(func1);
                queue.push(func2);

                // providing a cached consume_operation gives much better performances
                typename decltype(queue)::reentrant_consume_operation consume;

                /* The callable objects we are going to invoke will access the queue, so we
                    must use a reentrant consume. Note: during the invoke of the last function
                    the queue is empty to any observer. */
                while (queue.try_reentrant_consume(consume))
                    ;

                // Output:
                // The queue is not empty
                // The queue is empty
                //! [conc_function_queue try_reentrant_consume example 2]
            }
        }